

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O0

void scale_plane_4_to_1_phase_0
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,int dst_w,
               int dst_h)

{
  long in_RCX;
  undefined8 *in_RDX;
  long in_RSI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  __m128i d2;
  __m128i d1;
  __m128i d0;
  int x;
  int y;
  __m128i mask;
  int max_width;
  uint local_c0;
  int local_bc;
  longlong local_b8;
  longlong lStack_b0;
  uint local_a4;
  long local_98;
  undefined8 *local_90;
  long local_88;
  uint8_t *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 *local_60;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined4 local_2c;
  longlong local_28;
  longlong lStack_20;
  undefined4 local_10;
  undefined4 local_c;
  undefined4 local_8;
  undefined4 local_4;
  
  local_a4 = in_R8D + 0xfU & 0xfffffff0;
  local_2c = 0xff;
  local_4 = 0xff;
  local_8 = 0xff;
  local_c = 0xff;
  local_10 = 0xff;
  local_b8 = 0xff000000ff;
  lStack_b0 = 0xff000000ff;
  local_bc = in_R9D;
  local_98 = in_RCX;
  local_90 = in_RDX;
  local_88 = in_RSI;
  local_80 = in_RDI;
  local_28 = local_b8;
  lStack_20 = lStack_b0;
  do {
    local_c0 = local_a4;
    do {
      scale_plane_2_to_1_phase_0_kernel(local_80,(__m128i *)&local_b8);
      scale_plane_2_to_1_phase_0_kernel(local_80 + 0x20,(__m128i *)&local_b8);
      local_48 = (short)extraout_XMM0_Qa;
      sStack_46 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
      sStack_44 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
      sStack_42 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
      sStack_40 = (short)extraout_XMM0_Qb;
      sStack_3e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
      sStack_3c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
      sStack_3a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
      local_58 = (short)extraout_XMM0_Qa_00;
      sStack_56 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x10);
      sStack_54 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x20);
      sStack_52 = (short)((ulong)extraout_XMM0_Qa_00 >> 0x30);
      sStack_50 = (short)extraout_XMM0_Qb_00;
      sStack_4e = (short)((ulong)extraout_XMM0_Qb_00 >> 0x10);
      sStack_4c = (short)((ulong)extraout_XMM0_Qb_00 >> 0x20);
      sStack_4a = (short)((ulong)extraout_XMM0_Qb_00 >> 0x30);
      local_60 = local_90;
      local_78 = CONCAT17((0 < sStack_3a) * (sStack_3a < 0x100) *
                          (char)((ulong)extraout_XMM0_Qb >> 0x30) - (0xff < sStack_3a),
                          CONCAT16((0 < sStack_3c) * (sStack_3c < 0x100) *
                                   (char)((ulong)extraout_XMM0_Qb >> 0x20) - (0xff < sStack_3c),
                                   CONCAT15((0 < sStack_3e) * (sStack_3e < 0x100) *
                                            (char)((ulong)extraout_XMM0_Qb >> 0x10) -
                                            (0xff < sStack_3e),
                                            CONCAT14((0 < sStack_40) * (sStack_40 < 0x100) *
                                                     (char)extraout_XMM0_Qb - (0xff < sStack_40),
                                                     CONCAT13((0 < sStack_42) * (sStack_42 < 0x100)
                                                              * (char)((ulong)extraout_XMM0_Qa >>
                                                                      0x30) - (0xff < sStack_42),
                                                              CONCAT12((0 < sStack_44) *
                                                                       (sStack_44 < 0x100) *
                                                                       (char)((ulong)
                                                  extraout_XMM0_Qa >> 0x20) - (0xff < sStack_44),
                                                  CONCAT11((0 < sStack_46) * (sStack_46 < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa >> 0x10) -
                                                           (0xff < sStack_46),
                                                           (0 < local_48) * (local_48 < 0x100) *
                                                           (char)extraout_XMM0_Qa -
                                                           (0xff < local_48))))))));
      uStack_70 = CONCAT17((0 < sStack_4a) * (sStack_4a < 0x100) *
                           (char)((ulong)extraout_XMM0_Qb_00 >> 0x30) - (0xff < sStack_4a),
                           CONCAT16((0 < sStack_4c) * (sStack_4c < 0x100) *
                                    (char)((ulong)extraout_XMM0_Qb_00 >> 0x20) - (0xff < sStack_4c),
                                    CONCAT15((0 < sStack_4e) * (sStack_4e < 0x100) *
                                             (char)((ulong)extraout_XMM0_Qb_00 >> 0x10) -
                                             (0xff < sStack_4e),
                                             CONCAT14((0 < sStack_50) * (sStack_50 < 0x100) *
                                                      (char)extraout_XMM0_Qb_00 - (0xff < sStack_50)
                                                      ,CONCAT13((0 < sStack_52) *
                                                                (sStack_52 < 0x100) *
                                                                (char)((ulong)extraout_XMM0_Qa_00 >>
                                                                      0x30) - (0xff < sStack_52),
                                                                CONCAT12((0 < sStack_54) *
                                                                         (sStack_54 < 0x100) *
                                                                         (char)((ulong)
                                                  extraout_XMM0_Qa_00 >> 0x20) - (0xff < sStack_54),
                                                  CONCAT11((0 < sStack_56) * (sStack_56 < 0x100) *
                                                           (char)((ulong)extraout_XMM0_Qa_00 >> 0x10
                                                                 ) - (0xff < sStack_56),
                                                           (0 < local_58) * (local_58 < 0x100) *
                                                           (char)extraout_XMM0_Qa_00 -
                                                           (0xff < local_58))))))));
      *local_90 = local_78;
      local_90[1] = uStack_70;
      local_80 = local_80 + 0x40;
      local_90 = local_90 + 2;
      local_c0 = local_c0 - 0x10;
    } while (local_c0 != 0);
    local_80 = local_80 + (local_88 - (int)local_a4) * 4;
    local_90 = (undefined8 *)((local_98 - (int)local_a4) + (long)local_90);
    local_bc = local_bc + -1;
  } while (local_bc != 0);
  return;
}

Assistant:

static void scale_plane_4_to_1_phase_0(const uint8_t *src,
                                       const ptrdiff_t src_stride, uint8_t *dst,
                                       const ptrdiff_t dst_stride,
                                       const int dst_w, const int dst_h) {
  const int max_width = (dst_w + 15) & ~15;
  const __m128i mask = _mm_set1_epi32(0x000000FF);
  int y = dst_h;

  do {
    int x = max_width;
    do {
      const __m128i d0 = scale_plane_2_to_1_phase_0_kernel(&src[0], &mask);
      const __m128i d1 = scale_plane_2_to_1_phase_0_kernel(&src[32], &mask);
      const __m128i d2 = _mm_packus_epi16(d0, d1);
      _mm_storeu_si128((__m128i *)dst, d2);
      src += 64;
      dst += 16;
      x -= 16;
    } while (x);
    src += 4 * (src_stride - max_width);
    dst += dst_stride - max_width;
  } while (--y);
}